

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::
Own<kj::_::AdapterPromiseNode<siginfo_t,_kj::UnixEventPort::SignalPromiseAdapter>,_kj::_::PromiseDisposer>
::dispose(Own<kj::_::AdapterPromiseNode<siginfo_t,_kj::UnixEventPort::SignalPromiseAdapter>,_kj::_::PromiseDisposer>
          *this)

{
  AdapterPromiseNode<siginfo_t,_kj::UnixEventPort::SignalPromiseAdapter> *node;
  
  node = this->ptr;
  if (node != (AdapterPromiseNode<siginfo_t,_kj::UnixEventPort::SignalPromiseAdapter> *)0x0) {
    this->ptr = (AdapterPromiseNode<siginfo_t,_kj::UnixEventPort::SignalPromiseAdapter> *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      StaticDisposer::dispose(ptrCopy);
    }
  }